

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax_x86_avx512.cpp
# Opt level: O1

void ncnn::softmax(float *_ptr,int elemcount,int elempack)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 (*pauVar3) [32];
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  float *ptr;
  uint uVar9;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar10 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar21 [16];
  undefined1 extraout_var [60];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar27 [16];
  undefined1 auVar31 [64];
  __m128 _sum0;
  undefined1 auVar32 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar43;
  float fVar52;
  float fVar53;
  undefined1 auVar44 [16];
  float fVar54;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_b8 [16];
  undefined1 auVar15 [32];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 auVar40 [32];
  undefined1 auVar37 [28];
  
  auVar68 = in_ZMM6._0_16_;
  uVar9 = elemcount * elempack;
  pauVar3 = (undefined1 (*) [32])_ptr;
  if ((int)uVar9 < 8) {
    auVar31 = ZEXT3264(CONCAT428(0xff7fffff,
                                 CONCAT424(0xff7fffff,
                                           CONCAT420(0xff7fffff,
                                                     CONCAT416(0xff7fffff,
                                                               CONCAT412(0xff7fffff,
                                                                         CONCAT48(0xff7fffff,
                                                                                  0xff7fffffff7fffff
                                                                                 )))))));
    uVar4 = 0;
  }
  else {
    uVar4 = uVar9 & 0x7ffffff8;
    auVar31 = ZEXT3264(CONCAT428(0xff7fffff,
                                 CONCAT424(0xff7fffff,
                                           CONCAT420(0xff7fffff,
                                                     CONCAT416(0xff7fffff,
                                                               CONCAT412(0xff7fffff,
                                                                         CONCAT48(0xff7fffff,
                                                                                  0xff7fffffff7fffff
                                                                                 )))))));
    iVar7 = 7;
    do {
      auVar38 = vmaxps_avx(auVar31._0_32_,*pauVar3);
      auVar31 = ZEXT3264(auVar38);
      pauVar3 = pauVar3 + 1;
      iVar7 = iVar7 + 8;
    } while (iVar7 < (int)uVar9);
  }
  auVar12._8_4_ = 0xff7fffff;
  auVar12._0_8_ = 0xff7fffffff7fffff;
  auVar12._12_4_ = 0xff7fffff;
  uVar8 = uVar4 | 3;
  while ((int)uVar8 < (int)uVar9) {
    auVar12 = vmaxps_avx(auVar12,*(undefined1 (*) [16])*pauVar3);
    pauVar3 = (undefined1 (*) [32])(*pauVar3 + 0x10);
    uVar8 = uVar4 + 7;
    uVar4 = uVar4 + 4;
  }
  if ((int)uVar4 < (int)uVar9) {
    uVar6 = CONCAT44(0,~uVar4 + uVar9);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar6;
    auVar59 = vpshufd_avx(auVar32,0x44);
    auVar38._8_4_ = 0xff7fffff;
    auVar38._0_8_ = 0xff7fffffff7fffff;
    auVar38._12_4_ = 0xff7fffff;
    auVar38._16_4_ = 0xff7fffff;
    auVar38._20_4_ = 0xff7fffff;
    auVar38._24_4_ = 0xff7fffff;
    auVar38._28_4_ = 0xff7fffff;
    uVar5 = 0;
    auVar58._8_8_ = 0x8000000000000000;
    auVar58._0_8_ = 0x8000000000000000;
    auVar68 = vorps_avx(auVar59,auVar58);
    auVar32 = vorps_avx(auVar59,auVar58);
    auVar34 = vpcmpeqd_avx(in_ZMM10._0_16_,in_ZMM10._0_16_);
    auVar81 = vorps_avx(auVar59,auVar58);
    do {
      auVar40 = auVar38;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = uVar5;
      auVar74 = vpshufd_avx(auVar74,0x44);
      auVar78._16_16_ = auVar74;
      auVar78._0_16_ = auVar74;
      auVar69 = vorps_avx(auVar78,_DAT_005f1c00);
      auVar78 = vorps_avx(auVar78,_DAT_005f1c20);
      auVar21._0_8_ = auVar78._16_8_ ^ 0x8000000000000000;
      auVar21._8_4_ = auVar78._24_4_;
      auVar21._12_4_ = auVar78._28_4_ ^ 0x80000000;
      auVar21 = vpcmpgtq_avx(auVar21,auVar68);
      auVar84._0_8_ = auVar78._0_8_ ^ 0x8000000000000000;
      auVar84._8_4_ = auVar78._8_4_;
      auVar84._12_4_ = auVar78._12_4_ ^ 0x80000000;
      auVar74 = vpcmpgtq_avx(auVar84,auVar32);
      auVar74 = vpackssdw_avx(auVar74,auVar21);
      auVar85._0_8_ = auVar69._16_8_ ^ 0x8000000000000000;
      auVar85._8_4_ = auVar69._24_4_;
      auVar85._12_4_ = auVar69._28_4_ ^ 0x80000000;
      auVar84 = vpcmpgtq_avx(auVar85,auVar68);
      auVar44._0_8_ = auVar69._0_8_ ^ 0x8000000000000000;
      auVar44._8_4_ = auVar69._8_4_;
      auVar44._12_4_ = auVar69._12_4_ ^ 0x80000000;
      auVar44 = vpcmpgtq_avx(auVar44,auVar81);
      auVar44 = vpackssdw_avx(auVar44,auVar84);
      auVar74 = vpackssdw_avx(auVar34 ^ auVar44,auVar74 ^ auVar34);
      auVar44 = vpmovsxwd_avx(auVar74);
      auVar74 = vpunpckhwd_avx(auVar74,auVar74);
      auVar49._16_16_ = auVar74;
      auVar49._0_16_ = auVar44;
      auVar38 = vmaskmovps_avx(auVar49,*(undefined1 (*) [32])(*pauVar3 + uVar5 * 4));
      auVar38 = vmaxps_avx(auVar38,auVar40);
      uVar5 = uVar5 + 8;
    } while ((uVar6 + 8 & 0x1fffffff8) != uVar5);
    auVar68 = vorps_avx(auVar59,auVar58);
    auVar34._0_8_ = auVar78._0_8_ ^ 0x8000000000000000;
    auVar34._8_4_ = auVar78._8_4_;
    auVar34._12_4_ = auVar78._12_4_ ^ 0x80000000;
    auVar68 = vpcmpgtq_avx(auVar34,auVar68);
    auVar81 = vpackssdw_avx(auVar68,auVar21);
    auVar34 = vpcmpeqd_avx(auVar34,auVar34);
    auVar68 = vorps_avx(auVar59,auVar58);
    auVar59._8_4_ = auVar69._8_4_;
    auVar59._0_8_ = auVar69._0_8_ ^ 0x8000000000000000;
    auVar59._12_4_ = auVar69._12_4_ ^ 0x80000000;
    auVar32 = vpcmpgtq_avx(auVar59,auVar68);
    auVar32 = vpackssdw_avx(auVar32,auVar84);
    auVar32 = vblendvps_avx(auVar40._0_16_,auVar38._0_16_,auVar32 ^ auVar34);
    auVar81 = vblendvps_avx(auVar40._16_16_,auVar38._16_16_,auVar81 ^ auVar34);
    auVar32 = vmaxps_avx(auVar32,auVar81);
    auVar81 = vshufpd_avx(auVar32,auVar32,1);
    auVar32 = vmaxps_avx(auVar32,auVar81);
    auVar81 = vmovshdup_avx(auVar32);
    auVar32 = vmaxss_avx(auVar32,auVar81);
  }
  else {
    auVar32 = SUB6416(ZEXT464(0xff7fffff),0);
  }
  if (elempack == 4) {
    auVar81 = vmaxps_avx(auVar31._0_16_,auVar31._16_16_);
    auVar12 = vmaxps_avx(auVar12,auVar81);
    auVar31 = ZEXT3264(CONCAT1616(auVar12,auVar12));
  }
  if (elempack == 1) {
    auVar81 = vmaxps_avx(auVar31._16_16_,auVar31._0_16_);
    auVar34 = vshufpd_avx(auVar81,auVar81,3);
    auVar81 = vmaxps_avx(auVar81,auVar34);
    auVar34 = vmovshdup_avx(auVar81);
    auVar81 = vmaxss_avx(auVar81,auVar34);
    auVar32 = vmaxss_avx(auVar81,auVar32);
    auVar81 = vshufpd_avx(auVar12,auVar12,3);
    auVar12 = vmaxps_avx(auVar12,auVar81);
    auVar81 = vmovshdup_avx(auVar12);
    auVar12 = vmaxss_avx(auVar12,auVar81);
    auVar32 = vmaxss_avx(auVar12,auVar32);
    auVar12 = vshufps_avx(auVar32,auVar32,0);
    auVar31 = ZEXT3264(CONCAT1616(auVar12,auVar12));
  }
  pauVar3 = (undefined1 (*) [32])_ptr;
  if ((int)uVar9 < 8) {
    fVar60 = 0.0;
    fVar61 = 0.0;
    fVar62 = 0.0;
    fVar63 = 0.0;
    fVar64 = 0.0;
    fVar65 = 0.0;
    fVar66 = 0.0;
    fVar67 = 0.0;
    uVar4 = 0;
  }
  else {
    uVar4 = uVar9 & 0x7ffffff8;
    fVar60 = 0.0;
    fVar61 = 0.0;
    fVar62 = 0.0;
    fVar63 = 0.0;
    fVar64 = 0.0;
    fVar65 = 0.0;
    fVar66 = 0.0;
    fVar67 = 0.0;
    iVar7 = 7;
    auVar68._8_4_ = 0x3f000000;
    auVar68._0_8_ = 0x3f0000003f000000;
    auVar68._12_4_ = 0x3f000000;
    auVar69._8_4_ = 0x3f800000;
    auVar69._0_8_ = 0x3f8000003f800000;
    auVar69._12_4_ = 0x3f800000;
    auVar69._16_4_ = 0x3f800000;
    auVar69._20_4_ = 0x3f800000;
    auVar69._24_4_ = 0x3f800000;
    auVar69._28_4_ = 0x3f800000;
    auVar81._8_4_ = 0x3f800000;
    auVar81._0_8_ = 0x3f8000003f800000;
    auVar81._12_4_ = 0x3f800000;
    do {
      auVar38 = vsubps_avx(*pauVar3,auVar31._0_32_);
      auVar50._8_4_ = 0x42b0c0a5;
      auVar50._0_8_ = 0x42b0c0a542b0c0a5;
      auVar50._12_4_ = 0x42b0c0a5;
      auVar50._16_4_ = 0x42b0c0a5;
      auVar50._20_4_ = 0x42b0c0a5;
      auVar50._24_4_ = 0x42b0c0a5;
      auVar50._28_4_ = 0x42b0c0a5;
      auVar38 = vminps_avx(auVar38,auVar50);
      auVar51._8_4_ = 0xc2b0c0a5;
      auVar51._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar51._12_4_ = 0xc2b0c0a5;
      auVar51._16_4_ = 0xc2b0c0a5;
      auVar51._20_4_ = 0xc2b0c0a5;
      auVar51._24_4_ = 0xc2b0c0a5;
      auVar51._28_4_ = 0xc2b0c0a5;
      auVar78 = vmaxps_avx(auVar38,auVar51);
      auVar39._0_4_ = auVar78._0_4_ * 1.442695 + 0.5;
      auVar39._4_4_ = auVar78._4_4_ * 1.442695 + 0.5;
      auVar39._8_4_ = auVar78._8_4_ * 1.442695 + 0.5;
      auVar39._12_4_ = auVar78._12_4_ * 1.442695 + 0.5;
      auVar39._16_4_ = auVar78._16_4_ * 1.442695 + 0.5;
      auVar39._20_4_ = auVar78._20_4_ * 1.442695 + 0.5;
      auVar39._24_4_ = auVar78._24_4_ * 1.442695 + 0.5;
      auVar39._28_4_ = 0x3ff8aa3b;
      auVar40 = vroundps_avx(auVar39,1);
      auVar38 = vcmpps_avx(auVar39,auVar40,1);
      auVar38 = vandps_avx(auVar38,auVar69);
      auVar38 = vsubps_avx(auVar40,auVar38);
      fVar43 = auVar78._0_4_ + auVar38._0_4_ * -0.6931472;
      fVar52 = auVar78._4_4_ + auVar38._4_4_ * -0.6931472;
      fVar53 = auVar78._8_4_ + auVar38._8_4_ * -0.6931472;
      fVar54 = auVar78._12_4_ + auVar38._12_4_ * -0.6931472;
      fVar55 = auVar78._16_4_ + auVar38._16_4_ * -0.6931472;
      fVar56 = auVar78._20_4_ + auVar38._20_4_ * -0.6931472;
      fVar57 = auVar78._24_4_ + auVar38._24_4_ * -0.6931472;
      auVar33._0_4_ = (int)auVar38._0_4_;
      auVar33._4_4_ = (int)auVar38._4_4_;
      auVar33._8_4_ = (int)auVar38._8_4_;
      auVar33._12_4_ = (int)auVar38._12_4_;
      auVar40._16_4_ = (int)auVar38._16_4_;
      auVar40._0_16_ = auVar33;
      auVar40._20_4_ = (int)auVar38._20_4_;
      auVar40._24_4_ = (int)auVar38._24_4_;
      auVar40._28_4_ = (int)auVar38._28_4_;
      auVar59 = vpslld_avx(auVar33,0x17);
      auVar34 = vpslld_avx(auVar40._16_16_,0x17);
      auVar34 = vpaddd_avx(auVar81,auVar34);
      auVar59 = vpaddd_avx(auVar81,auVar59);
      fVar43 = (fVar43 + 1.0 +
               fVar43 * fVar43 *
               (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                 0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5)) * auVar59._0_4_;
      fVar52 = (fVar52 + 1.0 +
               fVar52 * fVar52 *
               (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) * fVar52 +
                 0.041665796) * fVar52 + 0.16666666) * fVar52 + 0.5)) * auVar59._4_4_;
      fVar53 = (fVar53 + 1.0 +
               fVar53 * fVar53 *
               (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) * fVar53 +
                 0.041665796) * fVar53 + 0.16666666) * fVar53 + 0.5)) * auVar59._8_4_;
      fVar54 = (fVar54 + 1.0 +
               fVar54 * fVar54 *
               (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) * fVar54 +
                 0.041665796) * fVar54 + 0.16666666) * fVar54 + 0.5)) * auVar59._12_4_;
      fVar55 = (fVar55 + 1.0 +
               fVar55 * fVar55 *
               (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) * fVar55 +
                 0.041665796) * fVar55 + 0.16666666) * fVar55 + 0.5)) * auVar34._0_4_;
      fVar56 = (fVar56 + 1.0 +
               fVar56 * fVar56 *
               (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) * fVar56 +
                 0.041665796) * fVar56 + 0.16666666) * fVar56 + 0.5)) * auVar34._4_4_;
      fVar57 = (fVar57 + 1.0 +
               fVar57 * fVar57 *
               (((((fVar57 * 0.00019875691 + 0.0013981999) * fVar57 + 0.008333452) * fVar57 +
                 0.041665796) * fVar57 + 0.16666666) * fVar57 + 0.5)) * auVar34._8_4_;
      *(float *)*pauVar3 = fVar43;
      *(float *)(*pauVar3 + 4) = fVar52;
      *(float *)(*pauVar3 + 8) = fVar53;
      *(float *)(*pauVar3 + 0xc) = fVar54;
      *(float *)(*pauVar3 + 0x10) = fVar55;
      *(float *)(*pauVar3 + 0x14) = fVar56;
      *(float *)(*pauVar3 + 0x18) = fVar57;
      *(float *)(*pauVar3 + 0x1c) = auVar34._12_4_;
      fVar60 = fVar43 + fVar60;
      fVar61 = fVar52 + fVar61;
      fVar62 = fVar53 + fVar62;
      fVar63 = fVar54 + fVar63;
      fVar64 = fVar55 + fVar64;
      fVar65 = fVar56 + fVar65;
      fVar66 = fVar57 + fVar66;
      fVar67 = auVar34._12_4_ + fVar67;
      pauVar3 = pauVar3 + 1;
      iVar7 = iVar7 + 8;
    } while (iVar7 < (int)uVar9);
  }
  auVar82 = (undefined1  [16])0x0;
  if ((int)(uVar4 | 3) < (int)uVar9) {
    auVar83 = ZEXT1664((undefined1  [16])0x0);
    auVar45._8_4_ = 0xc2b0c0a5;
    auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar45._12_4_ = 0xc2b0c0a5;
    auVar68._8_4_ = 0x3f800000;
    auVar68._0_8_ = 0x3f8000003f800000;
    auVar68._12_4_ = 0x3f800000;
    uVar8 = uVar4;
    do {
      auVar81 = vsubps_avx(*(undefined1 (*) [16])*pauVar3,auVar12);
      auVar22._8_4_ = 0x42b0c0a5;
      auVar22._0_8_ = 0x42b0c0a542b0c0a5;
      auVar22._12_4_ = 0x42b0c0a5;
      auVar81 = vminps_avx(auVar81,auVar22);
      auVar59 = vmaxps_avx(auVar81,auVar45);
      auVar31 = ZEXT3264(auVar83._0_32_);
      auVar79._0_4_ = auVar59._0_4_ * 1.442695 + 0.5;
      auVar79._4_4_ = auVar59._4_4_ * 1.442695 + 0.5;
      auVar79._8_4_ = auVar59._8_4_ * 1.442695 + 0.5;
      auVar79._12_4_ = auVar59._12_4_ * 1.442695 + 0.5;
      auVar86._0_4_ = (int)auVar79._0_4_;
      auVar86._4_4_ = (int)auVar79._4_4_;
      auVar86._8_4_ = (int)auVar79._8_4_;
      auVar86._12_4_ = (int)auVar79._12_4_;
      auVar34 = vcvtdq2ps_avx(auVar86);
      auVar81 = vcmpps_avx(auVar79,auVar34,1);
      auVar81 = vandps_avx(auVar81,auVar68);
      auVar81 = vsubps_avx(auVar34,auVar81);
      fVar43 = auVar81._0_4_ * -0.6931472 + auVar59._0_4_;
      fVar52 = auVar81._4_4_ * -0.6931472 + auVar59._4_4_;
      fVar53 = auVar81._8_4_ * -0.6931472 + auVar59._8_4_;
      fVar54 = auVar81._12_4_ * -0.6931472 + auVar59._12_4_;
      auVar80._0_4_ = (int)auVar81._0_4_;
      auVar80._4_4_ = (int)auVar81._4_4_;
      auVar80._8_4_ = (int)auVar81._8_4_;
      auVar80._12_4_ = (int)auVar81._12_4_;
      auVar81 = vpslld_avx(auVar80,0x17);
      auVar81 = vpaddd_avx(auVar81,auVar68);
      fVar43 = auVar81._0_4_ *
               (fVar43 * fVar43 *
                (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                  0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5) + fVar43 + 1.0);
      fVar52 = auVar81._4_4_ *
               (fVar52 * fVar52 *
                (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) * fVar52 +
                  0.041665796) * fVar52 + 0.16666666) * fVar52 + 0.5) + fVar52 + 1.0);
      fVar53 = auVar81._8_4_ *
               (fVar53 * fVar53 *
                (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) * fVar53 +
                  0.041665796) * fVar53 + 0.16666666) * fVar53 + 0.5) + fVar53 + 1.0);
      fVar54 = auVar81._12_4_ *
               (fVar54 * fVar54 *
                (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) * fVar54 +
                  0.041665796) * fVar54 + 0.16666666) * fVar54 + 0.5) + fVar54 + 1.0);
      *(float *)*pauVar3 = fVar43;
      *(float *)(*pauVar3 + 4) = fVar52;
      *(float *)(*pauVar3 + 8) = fVar53;
      *(float *)(*pauVar3 + 0xc) = fVar54;
      auVar82._0_4_ = auVar83._0_4_ + fVar43;
      auVar82._4_4_ = auVar83._4_4_ + fVar52;
      auVar82._8_4_ = auVar83._8_4_ + fVar53;
      auVar82._12_4_ = auVar83._12_4_ + fVar54;
      auVar83 = ZEXT1664(auVar82);
      pauVar3 = (undefined1 (*) [32])(*pauVar3 + 0x10);
      uVar4 = uVar8 + 4;
      iVar7 = uVar8 + 7;
      uVar8 = uVar4;
    } while (iVar7 < (int)uVar9);
  }
  auVar12 = ZEXT816(0) << 0x40;
  if ((int)uVar4 < (int)uVar9) {
    uVar6 = CONCAT44(0,~uVar4 + uVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar6;
    auVar34 = vpshufd_avx(auVar10,0x44);
    auVar68 = vpermilps_avx(auVar32,0);
    auVar13._16_16_ = auVar68;
    auVar13._0_16_ = auVar68;
    uVar5 = 0;
    auVar46._8_8_ = 0x8000000000000000;
    auVar46._0_8_ = 0x8000000000000000;
    auVar12 = vorps_avx(auVar34,auVar46);
    auVar32 = vorps_avx(auVar34,auVar46);
    auVar81 = vorps_avx(auVar34,auVar46);
    auVar31 = ZEXT864(0) << 0x20;
    do {
      auVar83 = auVar31;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar5;
      auVar68 = vpshufd_avx(auVar23,0x44);
      auVar28._16_16_ = auVar68;
      auVar28._0_16_ = auVar68;
      auVar69 = vorps_avx(auVar28,_DAT_005f1c00);
      auVar78 = vorps_avx(auVar28,_DAT_005f1c20);
      auVar74 = vpcmpgtq_avx(auVar78._16_16_ ^ auVar46,auVar12);
      auVar68 = vpcmpgtq_avx(auVar78._0_16_ ^ auVar46,auVar32);
      auVar59 = vpackssdw_avx(auVar68,auVar74);
      auVar68 = vpcmpeqd_avx(auVar74,auVar74);
      auVar44 = vpcmpgtq_avx(auVar69._16_16_ ^ auVar46,auVar12);
      auVar35._0_8_ = auVar69._0_8_ ^ 0x8000000000000000;
      auVar35._8_4_ = auVar69._8_4_;
      auVar35._12_4_ = auVar69._12_4_ ^ 0x80000000;
      auVar58 = vpcmpgtq_avx(auVar35,auVar81);
      auVar58 = vpackssdw_avx(auVar58,auVar44);
      auVar59 = vpackssdw_avx(auVar58 ^ auVar68,auVar59 ^ auVar68);
      auVar58 = vpmovsxwd_avx(auVar59);
      auVar59 = vpunpckhwd_avx(auVar59,auVar59);
      auVar29._16_16_ = auVar59;
      auVar29._0_16_ = auVar58;
      auVar38 = vmaskmovps_avx(auVar29,*(undefined1 (*) [32])(*pauVar3 + uVar5 * 4));
      auVar38 = vsubps_avx(auVar38,auVar13);
      auVar21 = auVar38._16_16_;
      local_1d8._0_4_ = expf(auVar38._16_4_);
      local_1d8._4_4_ = extraout_XMM0_Db;
      local_1d8._8_4_ = extraout_XMM0_Dc;
      local_1d8._12_4_ = extraout_XMM0_Dd;
      auVar59 = vmovshdup_avx(auVar21);
      auVar31._0_4_ = expf(auVar59._0_4_);
      auVar31._4_60_ = extraout_var;
      auVar59 = vinsertps_avx(local_1d8,auVar31._0_16_,0x10);
      auVar58 = vpermilpd_avx(auVar21,1);
      auVar16._0_4_ = expf(auVar58._0_4_);
      auVar16._4_60_ = extraout_var_00;
      auVar59 = vinsertps_avx(auVar59,auVar16._0_16_,0x20);
      auVar58 = vpermilps_avx(auVar21,0xff);
      auVar17._0_4_ = expf(auVar58._0_4_);
      auVar17._4_60_ = extraout_var_01;
      auVar59 = vinsertps_avx(auVar59,auVar17._0_16_,0x30);
      local_1b8._0_4_ = auVar38._0_4_;
      local_1d8._0_4_ = expf((float)local_1b8._0_4_);
      local_1d8._4_4_ = extraout_XMM0_Db_00;
      local_1d8._8_4_ = extraout_XMM0_Dc_00;
      local_1d8._12_4_ = extraout_XMM0_Dd_00;
      local_1b8 = auVar38._0_16_;
      auVar58 = vmovshdup_avx(local_1b8);
      auVar18._0_4_ = expf(auVar58._0_4_);
      auVar18._4_60_ = extraout_var_02;
      auVar58 = vinsertps_avx(local_1d8,auVar18._0_16_,0x10);
      auVar21 = vpermilpd_avx(local_1b8,1);
      auVar19._0_4_ = expf(auVar21._0_4_);
      auVar19._4_60_ = extraout_var_03;
      auVar58 = vinsertps_avx(auVar58,auVar19._0_16_,0x20);
      auVar21 = vpermilps_avx(local_1b8,0xff);
      auVar20._0_4_ = expf(auVar21._0_4_);
      auVar20._4_60_ = extraout_var_04;
      auVar58 = vinsertps_avx(auVar58,auVar20._0_16_,0x30);
      auVar14._16_16_ = auVar59;
      auVar14._0_16_ = auVar58;
      auVar38 = vmaskmovps_avx(auVar29,auVar14);
      *(undefined1 (*) [32])(*pauVar3 + uVar5 * 4) = auVar38;
      auVar11._0_4_ = auVar58._0_4_ + auVar83._0_4_;
      auVar11._4_4_ = auVar58._4_4_ + auVar83._4_4_;
      auVar11._8_4_ = auVar58._8_4_ + auVar83._8_4_;
      auVar11._12_4_ = auVar58._12_4_ + auVar83._12_4_;
      auVar15._16_4_ = auVar59._0_4_ + auVar83._16_4_;
      auVar15._0_16_ = auVar11;
      auVar15._20_4_ = auVar59._4_4_ + auVar83._20_4_;
      auVar15._24_4_ = auVar59._8_4_ + auVar83._24_4_;
      auVar15._28_4_ = auVar59._12_4_ + auVar83._28_4_;
      uVar5 = uVar5 + 8;
      auVar31 = ZEXT3264(auVar15);
    } while ((uVar6 + 8 & 0x1fffffff8) != uVar5);
    auVar12 = vpor_avx(auVar34,auVar46);
    auVar81 = auVar46 ^ auVar78._0_16_;
    auVar12 = vpcmpgtq_avx(auVar81,auVar12);
    auVar32 = vpackssdw_avx(auVar12,auVar74);
    auVar81 = vpcmpeqd_avx(auVar81,auVar81);
    auVar31 = ZEXT1664(auVar32 ^ auVar81);
    auVar12 = vpor_avx(auVar34,auVar46);
    local_b8 = auVar69._0_16_;
    auVar12 = vpcmpgtq_avx(auVar46 ^ local_b8,auVar12);
    auVar12 = vpackssdw_avx(auVar12,auVar44);
    auVar12 = vblendvps_avx(auVar83._0_16_,auVar11,auVar12 ^ auVar81);
    auVar32 = vblendvps_avx(auVar83._16_16_,auVar15._16_16_,auVar32 ^ auVar81);
    auVar12 = vhaddps_avx(auVar32,auVar12);
    auVar12 = vhaddps_avx(auVar12,auVar12);
    auVar12 = vhaddps_avx(auVar12,auVar12);
  }
  if (elempack == 8) {
    auVar30._8_4_ = 0x3f800000;
    auVar30._0_8_ = 0x3f8000003f800000;
    auVar30._12_4_ = 0x3f800000;
    auVar30._16_4_ = 0x3f800000;
    auVar30._20_4_ = 0x3f800000;
    auVar30._24_4_ = 0x3f800000;
    auVar30._28_4_ = 0x3f800000;
    auVar31 = ZEXT3264(auVar30);
    auVar2._4_4_ = fVar61;
    auVar2._0_4_ = fVar60;
    auVar2._8_4_ = fVar62;
    auVar2._12_4_ = fVar63;
    auVar2._16_4_ = fVar64;
    auVar2._20_4_ = fVar65;
    auVar2._24_4_ = fVar66;
    auVar2._28_4_ = fVar67;
    auVar41 = vdivps_avx(auVar30,auVar2);
  }
  else {
    auVar41._4_4_ = fVar61;
    auVar41._0_4_ = fVar60;
    auVar41._8_4_ = fVar62;
    auVar41._12_4_ = fVar63;
    auVar41._16_4_ = fVar64;
    auVar41._20_4_ = fVar65;
    auVar41._24_4_ = fVar66;
    auVar41._28_4_ = fVar67;
  }
  if (elempack == 4) {
    auVar24._0_4_ = auVar82._0_4_ + auVar41._16_4_ + auVar41._0_4_;
    auVar24._4_4_ = auVar82._4_4_ + auVar41._20_4_ + auVar41._4_4_;
    auVar24._8_4_ = auVar82._8_4_ + auVar41._24_4_ + auVar41._8_4_;
    auVar24._12_4_ = auVar82._12_4_ + auVar41._28_4_ + auVar41._12_4_;
    auVar31 = ZEXT1664(auVar24);
    auVar36._8_4_ = 0x3f800000;
    auVar36._0_8_ = 0x3f8000003f800000;
    auVar36._12_4_ = 0x3f800000;
    auVar82 = vdivps_avx(auVar36,auVar24);
    auVar41._16_16_ = auVar82;
    auVar41._0_16_ = auVar82;
  }
  auVar37 = auVar41._0_28_;
  if (elempack == 1) {
    auVar25._0_4_ = auVar41._16_4_ + auVar41._0_4_;
    auVar25._4_4_ = auVar41._20_4_ + auVar41._4_4_;
    auVar25._8_4_ = auVar41._24_4_ + auVar41._8_4_;
    auVar25._12_4_ = auVar41._28_4_ + auVar41._12_4_;
    auVar32 = vshufpd_avx(auVar25,auVar25,1);
    auVar26._0_4_ = auVar32._0_4_ + auVar25._0_4_;
    auVar26._4_4_ = auVar32._4_4_ + auVar25._4_4_;
    auVar26._8_4_ = auVar32._8_4_ + auVar25._8_4_;
    auVar26._12_4_ = auVar32._12_4_ + auVar25._12_4_;
    auVar32 = vmovshdup_avx(auVar26);
    auVar81 = vshufpd_avx(auVar82,auVar82,1);
    auVar47._0_4_ = auVar82._0_4_ + auVar81._0_4_;
    auVar47._4_4_ = auVar82._4_4_ + auVar81._4_4_;
    auVar47._8_4_ = auVar82._8_4_ + auVar81._8_4_;
    auVar47._12_4_ = auVar82._12_4_ + auVar81._12_4_;
    auVar81 = vmovshdup_avx(auVar47);
    auVar31 = ZEXT464(0x3f800000);
    auVar12 = ZEXT416((uint)(1.0 / (auVar81._0_4_ + auVar32._0_4_ +
                                   auVar12._0_4_ + auVar47._0_4_ + auVar26._0_4_)));
    auVar82 = vshufps_avx(auVar12,auVar12,0);
    auVar42._16_16_ = auVar82;
    auVar42._0_16_ = auVar82;
    auVar37 = auVar42._0_28_;
  }
  uVar4 = 0;
  if (7 < (int)uVar9) {
    uVar4 = uVar9 & 0x7ffffff8;
    iVar7 = 7;
    do {
      auVar83._0_4_ = auVar37._0_4_ * *(float *)*(undefined1 (*) [32])_ptr;
      auVar83._4_4_ = auVar37._4_4_ * *(float *)((long)*(undefined1 (*) [32])_ptr + 4);
      auVar83._8_4_ = auVar37._8_4_ * *(float *)((long)*(undefined1 (*) [32])_ptr + 8);
      auVar83._12_4_ = auVar37._12_4_ * *(float *)((long)*(undefined1 (*) [32])_ptr + 0xc);
      auVar83._16_4_ = auVar37._16_4_ * *(float *)((long)*(undefined1 (*) [32])_ptr + 0x10);
      auVar83._20_4_ = auVar37._20_4_ * *(float *)((long)*(undefined1 (*) [32])_ptr + 0x14);
      auVar83._28_36_ = auVar31._28_36_;
      auVar83._24_4_ = auVar37._24_4_ * *(float *)((long)*(undefined1 (*) [32])_ptr + 0x18);
      auVar31 = ZEXT3264(auVar83._0_32_);
      *(undefined1 (*) [32])_ptr = auVar83._0_32_;
      _ptr = (float *)((long)_ptr + 0x20);
      iVar7 = iVar7 + 8;
    } while (iVar7 < (int)uVar9);
  }
  uVar8 = uVar4 | 3;
  auVar38 = _DAT_005f1c00;
  auVar69 = _DAT_005f1c20;
  while (_DAT_005f1c00 = auVar38, _DAT_005f1c20 = auVar69, (int)uVar8 < (int)uVar9) {
    fVar60 = *(float *)((long)*(undefined1 (*) [32])_ptr + 4);
    fVar61 = *(float *)((long)*(undefined1 (*) [32])_ptr + 8);
    fVar62 = *(float *)((long)*(undefined1 (*) [32])_ptr + 0xc);
    *(float *)*(undefined1 (*) [32])_ptr = auVar82._0_4_ * *(float *)*(undefined1 (*) [32])_ptr;
    *(float *)((long)*(undefined1 (*) [32])_ptr + 4) = auVar82._4_4_ * fVar60;
    *(float *)((long)*(undefined1 (*) [32])_ptr + 8) = auVar82._8_4_ * fVar61;
    *(float *)((long)*(undefined1 (*) [32])_ptr + 0xc) = auVar82._12_4_ * fVar62;
    _ptr = (float *)((long)*(undefined1 (*) [32])_ptr + 0x10);
    uVar8 = uVar4 + 7;
    uVar4 = uVar4 + 4;
    auVar38 = _DAT_005f1c00;
    auVar69 = _DAT_005f1c20;
  }
  if ((int)uVar4 < (int)uVar9) {
    uVar5 = CONCAT44(0,uVar9 + ~uVar4);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar5;
    auVar34 = vpshufd_avx(auVar27,0x44);
    auVar59 = vshufps_avx(auVar12,auVar12,0);
    uVar6 = 0;
    auVar48._8_8_ = 0x8000000000000000;
    auVar48._0_8_ = 0x8000000000000000;
    auVar12 = vorps_avx(auVar34,auVar48);
    auVar32 = vorps_avx(auVar34,auVar48);
    auVar81 = vpcmpeqd_avx(auVar68,auVar68);
    auVar68 = vorps_avx(auVar34,auVar48);
    do {
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar6;
      auVar34 = vpshufd_avx(auVar70,0x44);
      auVar72._16_16_ = auVar34;
      auVar72._0_16_ = auVar34;
      auVar78 = vorps_avx(auVar72,auVar38);
      auVar40 = vorps_avx(auVar72,auVar69);
      auVar76._0_8_ = auVar40._16_8_ ^ 0x8000000000000000;
      auVar76._8_4_ = auVar40._24_4_;
      auVar76._12_4_ = auVar40._28_4_ ^ 0x80000000;
      auVar34 = vpcmpgtq_avx(auVar76,auVar12);
      auVar71._0_8_ = auVar40._0_8_ ^ 0x8000000000000000;
      auVar71._8_4_ = auVar40._8_4_;
      auVar71._12_4_ = auVar40._12_4_ ^ 0x80000000;
      auVar58 = vpcmpgtq_avx(auVar71,auVar32);
      auVar34 = vpackssdw_avx(auVar58,auVar34);
      auVar77._0_8_ = auVar78._16_8_ ^ 0x8000000000000000;
      auVar77._8_4_ = auVar78._24_4_;
      auVar77._12_4_ = auVar78._28_4_ ^ 0x80000000;
      auVar58 = vpcmpgtq_avx(auVar77,auVar12);
      auVar75._0_8_ = auVar78._0_8_ ^ 0x8000000000000000;
      auVar75._8_4_ = auVar78._8_4_;
      auVar75._12_4_ = auVar78._12_4_ ^ 0x80000000;
      auVar74 = vpcmpgtq_avx(auVar75,auVar68);
      auVar58 = vpackssdw_avx(auVar74,auVar58);
      auVar34 = vpackssdw_avx(auVar58 ^ auVar81,auVar34 ^ auVar81);
      auVar58 = vpmovsxwd_avx(auVar34);
      auVar34 = vpunpckhwd_avx(auVar34,auVar34);
      auVar73._16_16_ = auVar34;
      auVar73._0_16_ = auVar58;
      auVar78 = vmaskmovps_avx(auVar73,*(undefined1 (*) [32])
                                        ((long)*(undefined1 (*) [32])_ptr + uVar6 * 4));
      auVar1._4_4_ = auVar78._4_4_ * auVar59._4_4_;
      auVar1._0_4_ = auVar78._0_4_ * auVar59._0_4_;
      auVar1._8_4_ = auVar78._8_4_ * auVar59._8_4_;
      auVar1._12_4_ = auVar78._12_4_ * auVar59._12_4_;
      auVar1._16_4_ = auVar78._16_4_ * auVar59._0_4_;
      auVar1._20_4_ = auVar78._20_4_ * auVar59._4_4_;
      auVar1._24_4_ = auVar78._24_4_ * auVar59._8_4_;
      auVar1._28_4_ = auVar78._28_4_;
      auVar78 = vmaskmovps_avx(auVar73,auVar1);
      *(undefined1 (*) [32])((long)*(undefined1 (*) [32])_ptr + uVar6 * 4) = auVar78;
      uVar6 = uVar6 + 8;
    } while ((uVar5 + 8 & 0x1fffffff8) != uVar6);
  }
  return;
}

Assistant:

static void softmax(float* _ptr, int elemcount, int elempack)
{
    const int size = elemcount * elempack;

    // reduce max
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _max_avx512 = _mm512_set1_ps(-FLT_MAX);
#endif // __AVX512F__
    __m256 _max_avx = _mm256_set1_ps(-FLT_MAX);
#endif // __AVX__
    __m128 _max = _mm_set1_ps(-FLT_MAX);
#endif // __SSE2__
    float max = -FLT_MAX;
    {
        const float* ptr = _ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _max_avx512 = _mm512_max_ps(_max_avx512, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _max_avx = _mm256_max_ps(_max_avx, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _max = _mm_max_ps(_max, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            max = std::max(max, *ptr++);
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 8)
    {
        {
            __m256 _max0 = _mm512_castps512_ps256(_max_avx512);
            __m256 _max1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_max_avx512), 1));
            _max_avx = _mm256_max_ps(_max_avx, _max0);
            _max_avx = _mm256_max_ps(_max_avx, _max1);
        }

        _max_avx512 = combine8x2_ps(_max_avx, _max_avx);
    }
#endif // __AVX512F__
    if (elempack == 4)
    {
#if __AVX512F__
        {
            __m256 _max0 = _mm512_castps512_ps256(_max_avx512);
            __m256 _max1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_max_avx512), 1));
            _max_avx = _mm256_max_ps(_max_avx, _max0);
            _max_avx = _mm256_max_ps(_max_avx, _max1);
        }
#endif // __AVX512F__
        {
            __m128 _max0 = _mm256_castps256_ps128(_max_avx);
            __m128 _max1 = _mm256_extractf128_ps(_max_avx, 1);
            _max = _mm_max_ps(_max, _max0);
            _max = _mm_max_ps(_max, _max1);
        }

        _max_avx = combine4x2_ps(_max, _max);
#if __AVX512F__
        _max_avx512 = combine8x2_ps(_max_avx, _max_avx);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 1)
    {
#if __AVX__
#if __AVX512F__
        max = std::max(max, _mm512_comp_reduce_max_ps(_max_avx512));
#endif // __AVX512F__
        max = std::max(max, _mm256_reduce_max_ps(_max_avx));
#endif // __AVX__
        max = std::max(max, _mm_reduce_max_ps(_max));

        _max = _mm_set1_ps(max);
#if __AVX__
        _max_avx = combine4x2_ps(_max, _max);
#if __AVX512F__
        _max_avx512 = combine8x2_ps(_max_avx, _max_avx);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__

    // reduce exp(x - max)
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _sum_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _sum_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _sum = _mm_set1_ps(0.f);
#endif // __SSE2__
    float sum = 0.f;
    {
        float* ptr = _ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_sub_ps(_p, _max_avx512);
            _p = exp512_ps(_p);
            _mm512_storeu_ps(ptr, _p);
            _sum_avx512 = _mm512_add_ps(_sum_avx512, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_sub_ps(_p, _max_avx);
            _p = exp256_ps(_p);
            _mm256_storeu_ps(ptr, _p);
            _sum_avx = _mm256_add_ps(_sum_avx, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = _mm_sub_ps(_p, _max);
            _p = exp_ps(_p);
            _mm_storeu_ps(ptr, _p);
            _sum = _mm_add_ps(_sum, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            float v = expf(*ptr - max);
            *ptr = v;
            sum += v;
            ptr++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        _sum_avx512 = _mm512_div_ps(_mm512_set1_ps(1.f), _sum_avx512);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _sum0 = _mm512_castps512_ps256(_sum_avx512);
            __m256 _sum1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_sum_avx512), 1));
            _sum_avx = _mm256_add_ps(_sum_avx, _sum0);
            _sum_avx = _mm256_add_ps(_sum_avx, _sum1);
        }
#endif // __AVX512F__

        _sum_avx = _mm256_div_ps(_mm256_set1_ps(1.f), _sum_avx);

#if __AVX512F__
        _sum_avx512 = combine8x2_ps(_sum_avx, _sum_avx);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _sum0 = _mm512_castps512_ps256(_sum_avx512);
            __m256 _sum1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_sum_avx512), 1));
            _sum_avx = _mm256_add_ps(_sum_avx, _sum0);
            _sum_avx = _mm256_add_ps(_sum_avx, _sum1);
        }
#endif // __AVX512F__
        {
            __m128 _sum0 = _mm256_castps256_ps128(_sum_avx);
            __m128 _sum1 = _mm256_extractf128_ps(_sum_avx, 1);
            _sum = _mm_add_ps(_sum, _sum0);
            _sum = _mm_add_ps(_sum, _sum1);
        }
#endif // __AVX__

        _sum = _mm_div_ps(_mm_set1_ps(1.f), _sum);

#if __AVX__
        _sum_avx = combine4x2_ps(_sum, _sum);
#if __AVX512F__
        _sum_avx512 = combine8x2_ps(_sum_avx, _sum_avx);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
        sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
        sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__

        sum = 1.f / sum;

#if __SSE2__
        _sum = _mm_set1_ps(sum);
#if __AVX__
        _sum_avx = combine4x2_ps(_sum, _sum);
#if __AVX512F__
        _sum_avx512 = combine8x2_ps(_sum_avx, _sum_avx);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

    // div sum
    {
        float* ptr = _ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_mul_ps(_p, _sum_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_mul_ps(_p, _sum_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = _mm_mul_ps(_p, _sum);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr++ *= sum;
        }
    }
}